

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::BuildPreset> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::
Bind<std::function<bool(cmCMakePresetsGraph::BuildPreset&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCMakePresetsGraph::BuildPreset> *this,string_view *name,
          function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>
          *func,bool required)

{
  Object<cmCMakePresetsGraph::BuildPreset> *pOVar1;
  function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)> local_48;
  byte local_21;
  function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>
  *pfStack_20;
  bool required_local;
  function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>
  *func_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::BuildPreset> *this_local;
  
  local_21 = required;
  pfStack_20 = func;
  func_local = (function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>
                *)name;
  name_local = (string_view *)this;
  std::function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>::
  function(&local_48,func);
  pOVar1 = BindPrivate(this,name,&local_48,(bool)(local_21 & 1));
  std::function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>::
  ~function(&local_48);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }